

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::
     SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  type_conflict5 tVar1;
  uint uVar2;
  ulong uVar3;
  undefined4 in_register_0000000c;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  IdxElement *pIVar9;
  undefined7 in_register_00000081;
  uint uVar10;
  IdxElement *pIVar11;
  int start_00;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  int local_82c;
  IdxElement *local_828;
  uint local_81c;
  IdxCompare *local_818;
  long local_810;
  long local_808;
  ulong local_800;
  IdxElement *local_7f8;
  ulong local_7f0;
  IdxElement pivotkey;
  IdxElement tmp;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6e0;
  IdxElement local_660;
  IdxElement local_5dc;
  IdxElement local_558;
  IdxElement local_4d4;
  IdxElement local_450;
  IdxElement local_3cc;
  IdxElement local_348;
  IdxElement local_2c4;
  IdxElement local_240;
  IdxElement local_1bc;
  IdxElement local_138;
  IdxElement local_b4;
  
  uVar13 = CONCAT44(in_register_0000000c,start);
  local_81c = (uint)CONCAT71(in_register_00000081,type);
  if (end <= start + 1) {
    return;
  }
  uVar6 = (ulong)(end - 1);
  local_828 = keys;
  local_818 = compare;
LAB_0043b22c:
  iVar7 = (int)uVar6;
  start_00 = (int)uVar13;
  uVar2 = iVar7 - start_00;
  if ((int)uVar2 < 0x19) {
    if ((int)uVar2 < 1) {
      return;
    }
    SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (keys,iVar7,local_818,start_00);
    return;
  }
  pivotkey.val.m_backend.fpclass = cpp_dec_float_finite;
  pivotkey.val.m_backend.data._M_elems[0x18] = 0;
  pivotkey.val.m_backend.data._M_elems[0x19] = 0;
  pivotkey.val.m_backend.data._M_elems._104_5_ = 0;
  pivotkey.val.m_backend.data._M_elems[0x14] = 0;
  pivotkey.val.m_backend.data._M_elems[0x15] = 0;
  pivotkey.val.m_backend.data._M_elems[0x16] = 0;
  pivotkey.val.m_backend.data._M_elems[0x17] = 0;
  pivotkey.val.m_backend.data._M_elems[0x10] = 0;
  pivotkey.val.m_backend.data._M_elems[0x11] = 0;
  pivotkey.val.m_backend.data._M_elems[0x12] = 0;
  pivotkey.val.m_backend.data._M_elems[0x13] = 0;
  pivotkey.val.m_backend.data._M_elems[0xc] = 0;
  pivotkey.val.m_backend.data._M_elems[0xd] = 0;
  pivotkey.val.m_backend.data._M_elems[0xe] = 0;
  pivotkey.val.m_backend.data._M_elems[0xf] = 0;
  pivotkey.val.m_backend.data._M_elems[8] = 0;
  pivotkey.val.m_backend.data._M_elems[9] = 0;
  pivotkey.val.m_backend.data._M_elems[10] = 0;
  pivotkey.val.m_backend.data._M_elems[0xb] = 0;
  pivotkey.val.m_backend.data._M_elems[4] = 0;
  pivotkey.val.m_backend.data._M_elems[5] = 0;
  pivotkey.val.m_backend.data._M_elems[6] = 0;
  pivotkey.val.m_backend.data._M_elems[7] = 0;
  pivotkey.val.m_backend.data._M_elems[0] = 0;
  pivotkey.val.m_backend.data._M_elems[1] = 0;
  pivotkey.val.m_backend.data._M_elems[2] = 0;
  pivotkey.val.m_backend.data._M_elems[3] = 0;
  pivotkey.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  pivotkey.val.m_backend.exp = 0;
  pivotkey.val.m_backend.neg = false;
  pivotkey.val.m_backend.prec_elem = 0x1c;
  tmp.val.m_backend.fpclass = cpp_dec_float_finite;
  tmp.val.m_backend.data._M_elems[0x18] = 0;
  tmp.val.m_backend.data._M_elems[0x19] = 0;
  tmp.val.m_backend.data._M_elems._104_5_ = 0;
  tmp.val.m_backend.data._M_elems[0x14] = 0;
  tmp.val.m_backend.data._M_elems[0x15] = 0;
  tmp.val.m_backend.data._M_elems[0x16] = 0;
  tmp.val.m_backend.data._M_elems[0x17] = 0;
  tmp.val.m_backend.data._M_elems[0x10] = 0;
  tmp.val.m_backend.data._M_elems[0x11] = 0;
  tmp.val.m_backend.data._M_elems[0x12] = 0;
  tmp.val.m_backend.data._M_elems[0x13] = 0;
  tmp.val.m_backend.data._M_elems[0xc] = 0;
  tmp.val.m_backend.data._M_elems[0xd] = 0;
  tmp.val.m_backend.data._M_elems[0xe] = 0;
  tmp.val.m_backend.data._M_elems[0xf] = 0;
  tmp.val.m_backend.data._M_elems[8] = 0;
  tmp.val.m_backend.data._M_elems[9] = 0;
  tmp.val.m_backend.data._M_elems[10] = 0;
  tmp.val.m_backend.data._M_elems[0xb] = 0;
  tmp.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  tmp.val.m_backend.exp = 0;
  tmp.val.m_backend.neg = false;
  tmp.val.m_backend.data._M_elems[4] = 0;
  tmp.val.m_backend.data._M_elems[5] = 0;
  tmp.val.m_backend.data._M_elems[6] = 0;
  tmp.val.m_backend.data._M_elems[7] = 0;
  tmp.val.m_backend.data._M_elems[0] = 0;
  tmp.val.m_backend.data._M_elems[1] = 0;
  tmp.val.m_backend.data._M_elems[2] = 0;
  tmp.val.m_backend.data._M_elems[3] = 0;
  local_7f8 = keys + (int)((uVar2 >> 1) + start_00);
  tmp.val.m_backend.prec_elem = pivotkey.val.m_backend.prec_elem;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::IdxElement::operator=(&pivotkey,local_7f8);
  local_808 = (long)iVar7;
  local_810 = (long)start_00;
  uVar3 = uVar13 & 0xffffffff;
  uVar8 = uVar6 & 0xffffffff;
  local_800 = uVar6;
  local_7f0 = uVar13;
  do {
    lVar5 = (long)(int)uVar3;
    if ((local_81c & 1) == 0) {
      uVar13 = (ulong)(int)uVar8;
      pIVar9 = local_828 + lVar5;
      for (; lVar5 < local_808; lVar5 = lVar5 + 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_2c4,pIVar9);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_348,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_6e0,local_818,&local_2c4,&local_348);
        local_82c = 0;
        tVar1 = boost::multiprecision::operator<=(&local_6e0,&local_82c);
        if (!tVar1) break;
        pIVar9 = pIVar9 + 1;
      }
      pIVar9 = local_828 + uVar13;
      for (; local_810 < (long)uVar13; uVar13 = uVar13 - 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_3cc,pIVar9);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_450,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_6e0,local_818,&local_3cc,&local_450);
        local_82c = 0;
        tVar1 = boost::multiprecision::operator>(&local_6e0,&local_82c);
        if (!tVar1) break;
        pIVar9 = pIVar9 + -1;
      }
    }
    else {
      pIVar9 = local_828 + lVar5;
      for (; lVar5 < local_808; lVar5 = lVar5 + 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_b4,pIVar9);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_138,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_6e0,local_818,&local_b4,&local_138);
        local_82c = 0;
        tVar1 = boost::multiprecision::operator<(&local_6e0,&local_82c);
        if (!tVar1) break;
        pIVar9 = pIVar9 + 1;
      }
      uVar13 = (ulong)(int)uVar8;
      pIVar9 = local_828 + uVar13;
      for (; local_810 < (long)uVar13; uVar13 = uVar13 - 1) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_1bc,pIVar9);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_240,&pivotkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_6e0,local_818,&local_1bc,&local_240);
        local_82c = 0;
        tVar1 = boost::multiprecision::operator>=(&local_6e0,&local_82c);
        if (!tVar1) break;
        pIVar9 = pIVar9 + -1;
      }
    }
    pIVar9 = local_828;
    uVar2 = (uint)lVar5;
    iVar7 = (int)uVar13;
    if (iVar7 <= (int)uVar2) break;
    pIVar11 = local_828 + (int)uVar2;
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(&tmp,pIVar11);
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(pIVar11,pIVar9 + iVar7);
    SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::IdxElement::operator=(pIVar9 + iVar7,&tmp);
    uVar3 = (ulong)(uVar2 + 1);
    uVar8 = (ulong)(iVar7 - 1);
  } while( true );
  if ((local_81c & 1) == 0) {
    uVar13 = (ulong)iVar7;
    pIVar9 = local_828 + uVar13;
    for (; local_810 < (long)uVar13; uVar13 = uVar13 - 1) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_5dc,&pivotkey);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_660,pIVar9);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxCompare::operator()(&local_6e0,local_818,&local_5dc,&local_660);
      local_82c = 0;
      tVar1 = boost::multiprecision::operator<=(&local_6e0,&local_82c);
      if (!tVar1) break;
      pIVar9 = pIVar9 + -1;
    }
    uVar6 = local_800;
    iVar7 = (int)local_800;
    if (iVar7 == (int)uVar13) {
      pIVar11 = local_828 + local_808;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(&tmp,pIVar11);
      pIVar9 = local_7f8;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar11,local_7f8);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar9,&tmp);
      uVar13 = (ulong)(iVar7 - 1);
    }
  }
  else {
    uVar6 = (ulong)(int)uVar2;
    pIVar9 = local_828 + uVar6;
    for (; (long)uVar6 < local_808; uVar6 = uVar6 + 1) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_4d4,&pivotkey);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&local_558,pIVar9);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxCompare::operator()(&local_6e0,local_818,&local_4d4,&local_558);
      local_82c = 0;
      tVar1 = boost::multiprecision::operator>=(&local_6e0,&local_82c);
      if (!tVar1) break;
      pIVar9 = pIVar9 + 1;
    }
    iVar7 = (int)local_7f0;
    if (iVar7 == (int)uVar6) {
      pIVar11 = local_828 + local_810;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(&tmp,pIVar11);
      pIVar9 = local_7f8;
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar11,local_7f8);
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(pIVar9,&tmp);
      uVar6 = (ulong)(iVar7 + 1);
    }
    uVar2 = (uint)uVar6;
    uVar6 = local_800;
  }
  keys = local_828;
  uVar12 = (uint)uVar13;
  uVar4 = (uint)local_7f0;
  uVar10 = (uint)uVar6;
  if ((int)(uVar10 - uVar2) < (int)(uVar12 - uVar4)) {
    bVar15 = SBORROW4(uVar10,uVar2);
    iVar7 = uVar10 - uVar2;
    bVar14 = uVar10 == uVar2;
    uVar6 = uVar13 & 0xffffffff;
    uVar12 = uVar10;
    uVar10 = uVar2;
    uVar2 = uVar4;
  }
  else {
    bVar15 = SBORROW4(uVar12,uVar4);
    iVar7 = uVar12 - uVar4;
    bVar14 = uVar12 == uVar4;
    uVar10 = uVar4;
  }
  if (!bVar14 && bVar15 == iVar7 < 0) {
    SPxQuicksort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
              (local_828,uVar12 + 1,local_818,uVar10,(bool)(~(byte)local_81c & 1));
  }
  local_81c = local_81c ^ 1;
  uVar13 = (ulong)uVar2;
  goto LAB_0043b22c;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}